

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLUtils.cpp
# Opt level: O0

String * __thiscall
Diligent::BuildGLSLSourceString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,BuildGLSLSourceStringAttribs *Attribs)

{
  undefined *puVar1;
  bool bVar2;
  bool bVar3;
  SHADER_COMPILE_FLAGS SVar4;
  Char *Message;
  undefined8 uVar5;
  ostream *poVar6;
  void *this_00;
  ulong uVar7;
  char *pcVar8;
  Char *local_368;
  undefined1 local_2e0 [8];
  String ConvertedSource;
  Char *local_2b0;
  undefined1 local_2a8 [8];
  ConversionAttribs ConvertAttribs;
  HLSL2GLSLConverterImpl *Converter;
  string local_250 [32];
  stringstream local_230 [8];
  stringstream verss;
  ostream local_220 [383];
  undefined1 local_a1;
  SHADER_TYPE local_a0;
  bool local_99;
  SHADER_TYPE ShaderType;
  uint uStack_94;
  bool IsES;
  ShaderVersion GLSLVer;
  undefined1 local_88 [8];
  string _msg;
  ShaderSourceFileData SourceData;
  undefined1 local_40 [8];
  string msg;
  ShaderCreateInfo *ShaderCI;
  BuildGLSLSourceStringAttribs *Attribs_local;
  String *GLSLSource;
  
  msg.field_2._8_8_ = *(undefined8 *)this;
  if ((((((ShaderCreateInfo *)msg.field_2._8_8_)->SourceLanguage == SHADER_SOURCE_LANGUAGE_DEFAULT)
       || (((ShaderCreateInfo *)msg.field_2._8_8_)->SourceLanguage == SHADER_SOURCE_LANGUAGE_GLSL))
      || (((ShaderCreateInfo *)msg.field_2._8_8_)->SourceLanguage ==
          SHADER_SOURCE_LANGUAGE_GLSL_VERBATIM)) ||
     (((ShaderCreateInfo *)msg.field_2._8_8_)->SourceLanguage == SHADER_SOURCE_LANGUAGE_HLSL)) {
    ReadShaderSourceFile
              ((ShaderSourceFileData *)((long)&_msg.field_2 + 8),
               (ShaderCreateInfo *)msg.field_2._8_8_);
    if (*(int *)(msg.field_2._8_8_ + 0x58) == 3) {
      bVar2 = ShaderMacroArray::operator_cast_to_bool
                        ((ShaderMacroArray *)(msg.field_2._8_8_ + 0x30));
      if (bVar2) {
        FormatString<char[55]>
                  ((string *)local_88,
                   (char (*) [55])"Shader macros are ignored when compiling GLSL verbatim");
        puVar1 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar5 = std::__cxx11::string::c_str();
          (*(code *)puVar1)(1,uVar5,0);
        }
        std::__cxx11::string::~string((string *)local_88);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,(char *)SourceData.pFileData.m_pObject,
                 (ulong)(uint)SourceData.Source,(allocator *)((long)&GLSLVer.Minor + 3));
      std::allocator<char>::~allocator((allocator<char> *)((long)&GLSLVer.Minor + 3));
    }
    else {
      Version::Version((Version *)&ShaderType);
      local_99 = false;
      GetGLSLVersion((ShaderCreateInfo *)msg.field_2._8_8_,*(TargetGLSLCompiler *)(this + 0x3c),
                     *(RENDER_DEVICE_TYPE *)(this + 0x18),
                     (RenderDeviceShaderVersionInfo *)(this + 0x1c),(Version *)&ShaderType,&local_99
                    );
      local_a0 = *(SHADER_TYPE *)(msg.field_2._8_8_ + 0x48);
      local_a1 = 0;
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      std::__cxx11::stringstream::stringstream(local_230);
      poVar6 = std::operator<<(local_220,"#version ");
      this_00 = (void *)std::ostream::operator<<(poVar6,ShaderType);
      poVar6 = (ostream *)std::ostream::operator<<(this_00,uStack_94);
      pcVar8 = "0 core\n";
      if ((local_99 & 1U) != 0) {
        pcVar8 = "0 es\n";
      }
      std::operator<<(poVar6,pcVar8);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_250);
      std::__cxx11::string::~string(local_250);
      std::__cxx11::stringstream::~stringstream(local_230);
      if ((local_99 & 1U) != 0) {
        AppendGLESExtensions
                  (local_a0,*(DeviceFeatures **)(this + 0x10),
                   (TextureProperties *)(*(long *)(this + 8) + 0x10c),(ShaderVersion *)&ShaderType,
                   __return_storage_ptr__);
      }
      if ((*(long *)(msg.field_2._8_8_ + 0x88) != 0) &&
         (**(char **)(msg.field_2._8_8_ + 0x88) != '\0')) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      if ((local_99 & 1U) == 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      if (((byte)this[0x40] & 1) != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      if (*(long *)(this + 0x48) != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      AppendPlatformDefinition(__return_storage_ptr__);
      AppendShaderTypeDefinitions(__return_storage_ptr__,local_a0);
      if ((local_99 & 1U) != 0) {
        AppendPrecisionQualifiers
                  (*(DeviceFeatures **)(this + 0x10),
                   (TextureProperties *)(*(long *)(this + 8) + 0x10c),(ShaderVersion *)&ShaderType,
                   __return_storage_ptr__);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      AppendShaderMacros(__return_storage_ptr__,(ShaderMacroArray *)(msg.field_2._8_8_ + 0x30));
      bVar2 = false;
      if ((local_99 & 1U) != 0) {
        Version::Version((Version *)&Converter,3,0);
        bVar3 = Version::operator==((Version *)&ShaderType,(Version *)&Converter);
        bVar2 = false;
        if ((bVar3) && (bVar2 = false, **(char **)(this + 0x10) != '\0')) {
          bVar2 = local_a0 == SHADER_TYPE_VERTEX;
        }
      }
      if (bVar2) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      if (*(int *)(msg.field_2._8_8_ + 0x58) == 1) {
        if (((*(byte *)(msg.field_2._8_8_ + 0x4c) & 1) == 0) &&
           (SVar4 = operator&(*(SHADER_COMPILE_FLAGS *)(msg.field_2._8_8_ + 0x80),
                              SHADER_COMPILE_FLAG_HLSL_TO_SPIRV_VIA_GLSL),
           SVar4 == SHADER_COMPILE_FLAG_NONE)) {
          LogError<true,char[70]>
                    (false,"BuildGLSLSourceString",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLUtils.cpp"
                     ,0x171,(char (*) [70])
                            "Combined texture samplers are required to convert HLSL source to GLSL")
          ;
        }
        ConvertAttribs._64_8_ = HLSL2GLSLConverterImpl::GetInstance();
        HLSL2GLSLConverterImpl::ConversionAttribs::ConversionAttribs((ConversionAttribs *)local_2a8)
        ;
        local_2a8 = *(undefined1 (*) [8])(msg.field_2._8_8_ + 8);
        ConvertAttribs.pSourceStreamFactory = *(IShaderSourceInputStreamFactory **)(this + 0x50);
        ConvertAttribs.ppConversionStream =
             (IHLSL2GLSLConversionStream **)SourceData.pFileData.m_pObject;
        ConvertAttribs.HLSLSource = (Char *)(ulong)(uint)SourceData.Source;
        ConvertAttribs.NumSymbols = *(size_t *)(msg.field_2._8_8_ + 0x28);
        ConvertAttribs.EntryPoint._0_4_ = *(undefined4 *)(msg.field_2._8_8_ + 0x48);
        ConvertAttribs.EntryPoint._4_1_ = 1;
        ConvertAttribs._40_8_ = *(undefined8 *)msg.field_2._8_8_;
        if (*(long *)(msg.field_2._8_8_ + 0x50) == 0) {
          ShaderDesc::ShaderDesc((ShaderDesc *)((long)&ConvertedSource.field_2 + 8));
          local_368 = local_2b0;
        }
        else {
          local_368 = *(Char **)(msg.field_2._8_8_ + 0x50);
        }
        ConvertAttribs.InputFileName = local_368;
        ConvertAttribs.SamplerSuffix._0_1_ = **(char **)(this + 0x10) != '\0';
        SVar4 = operator&(*(SHADER_COMPILE_FLAGS *)(msg.field_2._8_8_ + 0x80),
                          SHADER_COMPILE_FLAG_PACK_MATRIX_ROW_MAJOR);
        ConvertAttribs.SamplerSuffix._1_1_ = SVar4 != SHADER_COMPILE_FLAG_NONE;
        HLSL2GLSLConverterImpl::Convert_abi_cxx11_
                  ((String *)local_2e0,(HLSL2GLSLConverterImpl *)ConvertAttribs._64_8_,
                   (ConversionAttribs *)local_2a8);
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) != 0) {
          LogError<true,char[38]>
                    (false,"BuildGLSLSourceString",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLUtils.cpp"
                     ,0x18b,(char (*) [38])"Failed to convert HLSL source to GLSL");
        }
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)local_2e0);
      }
      else {
        std::__cxx11::string::append
                  ((char *)__return_storage_ptr__,(ulong)SourceData.pFileData.m_pObject);
      }
      local_a1 = 1;
    }
    GLSLVer.Major = 1;
    ShaderSourceFileData::~ShaderSourceFileData((ShaderSourceFileData *)((long)&_msg.field_2 + 8));
  }
  else {
    FormatString<char[35]>((string *)local_40,(char (*) [35])"Unsupported shader source language");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"BuildGLSLSourceString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLUtils.cpp"
               ,0x100);
    std::__cxx11::string::~string((string *)local_40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",
               (allocator<char> *)((long)&SourceData.SourceLength + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)&SourceData.SourceLength + 3));
  }
  return __return_storage_ptr__;
}

Assistant:

String BuildGLSLSourceString(const BuildGLSLSourceStringAttribs& Attribs) noexcept(false)
{
    const ShaderCreateInfo& ShaderCI = Attribs.ShaderCI;

    if (!(ShaderCI.SourceLanguage == SHADER_SOURCE_LANGUAGE_DEFAULT ||
          ShaderCI.SourceLanguage == SHADER_SOURCE_LANGUAGE_GLSL ||
          ShaderCI.SourceLanguage == SHADER_SOURCE_LANGUAGE_GLSL_VERBATIM ||
          ShaderCI.SourceLanguage == SHADER_SOURCE_LANGUAGE_HLSL))
    {
        UNSUPPORTED("Unsupported shader source language");
        return "";
    }

    const ShaderSourceFileData SourceData = ReadShaderSourceFile(ShaderCI);
    if (ShaderCI.SourceLanguage == SHADER_SOURCE_LANGUAGE_GLSL_VERBATIM)
    {
        if (ShaderCI.Macros)
        {
            LOG_WARNING_MESSAGE("Shader macros are ignored when compiling GLSL verbatim");
        }

        return std::string{SourceData.Source, SourceData.SourceLength};
    }

    ShaderVersion GLSLVer;
    bool          IsES = false;
    GetGLSLVersion(ShaderCI, Attribs.TargetCompiler, Attribs.DeviceType, Attribs.MaxShaderVersion, GLSLVer, IsES);

    const SHADER_TYPE ShaderType = ShaderCI.Desc.ShaderType;

    String GLSLSource;
    {
        std::stringstream verss;
        verss << "#version " << Uint32{GLSLVer.Major} << Uint32{GLSLVer.Minor} << (IsES ? "0 es\n" : "0 core\n");
        GLSLSource = verss.str();
    }

    // All extensions must go right after the version directive
    if (IsES)
    {
        AppendGLESExtensions(ShaderType, Attribs.Features, Attribs.AdapterInfo.Texture, GLSLVer, GLSLSource);
    }

    if (ShaderCI.GLSLExtensions != nullptr && ShaderCI.GLSLExtensions[0] != '\0')
    {
        GLSLSource.append(ShaderCI.GLSLExtensions);
        GLSLSource.push_back('\n');
    }

    if (IsES)
    {
        GLSLSource.append("#ifndef GL_ES\n"
                          "#  define GL_ES 1\n"
                          "#endif\n");
    }
    else
    {
        GLSLSource.append("#define DESKTOP_GL 1\n");
    }

    if (Attribs.ZeroToOneClipZ)
    {
        GLSLSource.append("#define _NDC_ZERO_TO_ONE 1\n");
    }

    if (Attribs.ExtraDefinitions != nullptr)
    {
        GLSLSource.append(Attribs.ExtraDefinitions);
    }

    AppendPlatformDefinition(GLSLSource);
    AppendShaderTypeDefinitions(GLSLSource, ShaderType);

    if (IsES)
    {
        AppendPrecisionQualifiers(Attribs.Features, Attribs.AdapterInfo.Texture, GLSLVer, GLSLSource);
    }

    // It would be much more convenient to use row_major matrices.
    // But unfortunately on NVIDIA, the following directive
    // layout(std140, row_major) uniform;
    // does not have any effect on matrices that are part of structures
    // So we have to use column-major matrices which are default in both
    // DX and GLSL.
    GLSLSource.append("layout(std140) uniform;\n");

    AppendShaderMacros(GLSLSource, ShaderCI.Macros);

    if (IsES && GLSLVer == ShaderVersion{3, 0} && Attribs.Features.SeparablePrograms && ShaderType == SHADER_TYPE_VERTEX)
    {
        // From https://www.khronos.org/registry/OpenGL/extensions/EXT/EXT_separate_shader_objects.gles.txt:
        //
        // When using GLSL ES 3.00 shaders in separable programs, gl_Position and
        // gl_PointSize built-in outputs must be redeclared according to Section 7.5
        // of the OpenGL Shading Language Specification...
        //
        // add to GLSL ES 3.00 new section 7.5, Built-In Redeclaration and
        // Separable Programs:
        //
        // "The following vertex shader outputs may be redeclared at global scope to
        // specify a built-in output interface, with or without special qualifiers:
        //
        //     gl_Position
        //     gl_PointSize
        //
        //   When compiling shaders using either of the above variables, both such
        //   variables must be redeclared prior to use.  ((Note:  This restriction
        //   applies only to shaders using version 300 that enable the
        //   EXT_separate_shader_objects extension; shaders not enabling the
        //   extension do not have this requirement.))  A separable program object
        //   will fail to link if any attached shader uses one of the above variables
        //   without redeclaration."
        GLSLSource.append("out vec4 gl_Position;\n");
    }

    if (ShaderCI.SourceLanguage == SHADER_SOURCE_LANGUAGE_HLSL)
    {
#if DILIGENT_NO_HLSL
        LOG_ERROR_AND_THROW("Unable to convert HLSL source to GLSL: HLSL support is disabled");
#else
        if (!ShaderCI.Desc.UseCombinedTextureSamplers && (ShaderCI.CompileFlags & SHADER_COMPILE_FLAG_HLSL_TO_SPIRV_VIA_GLSL) == 0)
        {
            LOG_ERROR_AND_THROW("Combined texture samplers are required to convert HLSL source to GLSL");
        }
        // Convert HLSL to GLSL
        const HLSL2GLSLConverterImpl& Converter = HLSL2GLSLConverterImpl::GetInstance();

        HLSL2GLSLConverterImpl::ConversionAttribs ConvertAttribs;
        ConvertAttribs.pSourceStreamFactory = ShaderCI.pShaderSourceStreamFactory;
        ConvertAttribs.ppConversionStream   = Attribs.ppConversionStream;
        ConvertAttribs.HLSLSource           = SourceData.Source;
        ConvertAttribs.NumSymbols           = SourceData.SourceLength;
        ConvertAttribs.EntryPoint           = ShaderCI.EntryPoint;
        ConvertAttribs.ShaderType           = ShaderCI.Desc.ShaderType;
        ConvertAttribs.IncludeDefinitions   = true;
        ConvertAttribs.InputFileName        = ShaderCI.FilePath;
        ConvertAttribs.SamplerSuffix        = ShaderCI.Desc.CombinedSamplerSuffix != nullptr ?
            ShaderCI.Desc.CombinedSamplerSuffix :
            ShaderDesc{}.CombinedSamplerSuffix;
        // Separate shader objects extension also allows input/output layout qualifiers for
        // all shader stages.
        // https://www.khronos.org/registry/OpenGL/extensions/ARB/ARB_separate_shader_objects.txt
        // (search for "Input Layout Qualifiers" and "Output Layout Qualifiers").
        ConvertAttribs.UseInOutLocationQualifiers = Attribs.Features.SeparablePrograms;
        ConvertAttribs.UseRowMajorMatrices        = (ShaderCI.CompileFlags & SHADER_COMPILE_FLAG_PACK_MATRIX_ROW_MAJOR) != 0;
        String ConvertedSource                    = Converter.Convert(ConvertAttribs);
        if (ConvertedSource.empty())
        {
            LOG_ERROR_AND_THROW("Failed to convert HLSL source to GLSL");
        }
        GLSLSource.append(ConvertedSource);
#endif
    }
    else
    {
        GLSLSource.append(SourceData.Source, SourceData.SourceLength);
    }

    return GLSLSource;
}